

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix_with_column_compression.h
# Opt level: O0

void Gudhi::persistence_matrix::swap
               (Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
                *matrix1,
               Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
               *matrix2)

{
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
  *matrix2_local;
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
  *matrix1_local;
  
  boost::intrusive::
  bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
  ::swap((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
          *)matrix1,
         (bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
          *)matrix2);
  std::
  swap<boost::disjoint_sets_with_storage<boost::typed_identity_property_map<unsigned_long>,boost::typed_identity_property_map<unsigned_long>,boost::find_with_full_path_compression>>
            (&matrix1->columnClasses_,&matrix2->columnClasses_);
  std::
  vector<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ::swap(&matrix1->repToColumn_,&matrix2->repToColumn_);
  std::swap<unsigned_int>(&matrix1->nextColumnIndex_,&matrix2->nextColumnIndex_);
  std::
  swap<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>::Column_z2_settings*>
            (&matrix1->colSettings_,&matrix2->colSettings_);
  std::
  swap<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>::Column>,std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,(Gudhi::persistence_matrix::Column_types)7>>>::Column>>>
            (&matrix1->columnPool_,&matrix2->columnPool_);
  return;
}

Assistant:

void swap(Base_matrix_with_column_compression& matrix1, Base_matrix_with_column_compression& matrix2) {
    matrix1.columnToRep_.swap(matrix2.columnToRep_);
    std::swap(matrix1.columnClasses_, matrix2.columnClasses_);
    matrix1.repToColumn_.swap(matrix2.repToColumn_);
    std::swap(matrix1.nextColumnIndex_, matrix2.nextColumnIndex_);
    std::swap(matrix1.colSettings_, matrix2.colSettings_);
    std::swap(matrix1.columnPool_, matrix2.columnPool_);

    if constexpr (Master_matrix::Option_list::has_row_access) {
      swap(static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix1),
           static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix2));
    }
  }